

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O2

void __thiscall DrawerCommandQueue::Finish(DrawerCommandQueue *this)

{
  pointer ppDVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  DrawerCommand **command;
  pointer ppDVar7;
  int iVar8;
  unique_lock<std::mutex> end_lock;
  unique_lock<std::mutex> start_lock;
  unique_lock<std::mutex> uStack_1cdb0;
  unique_lock<std::mutex> uStack_1cda0;
  thread tStack_1cd90;
  undefined4 uStack_1cd88;
  int iStack_1cd84;
  undefined8 uStack_1cd80;
  undefined1 auStack_1cd78 [14400];
  undefined1 *puStack_19538;
  undefined1 auStack_19530 [57600];
  undefined1 *local_b430;
  
  Instance();
  if (Instance::queue.commands.super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      Instance::queue.commands.super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::unique_lock<std::mutex>::unique_lock(&uStack_1cda0,&Instance::queue.start_mutex);
    std::_Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::_Vector_impl_data::
    _M_swap_data((_Vector_impl_data *)&Instance::queue.active_commands,
                 (_Vector_impl_data *)&Instance::queue.commands);
    Instance::queue.run_id = Instance::queue.run_id + 1;
    std::unique_lock<std::mutex>::unlock(&uStack_1cda0);
    StartThreads(&Instance::queue);
    std::condition_variable::notify_all();
    puStack_19538 = auStack_1cd78;
    tStack_1cd90._M_id._M_thread = (id)0;
    uStack_1cd80 = 0xe1000000000;
    local_b430 = auStack_19530;
    uStack_1cd88 = 0;
    iStack_1cd84 = (int)(((long)Instance::queue.threads.
                                super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)Instance::queue.threads.
                               super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x1cd68) + 1;
    iVar8 = 0;
    while (iVar8 < Instance::queue.num_passes) {
      iVar3 = Instance::queue.rows_in_pass * iVar8;
      iVar8 = iVar8 + 1;
      iVar2 = Instance::queue.rows_in_pass * iVar8;
      iVar4 = 0xe10;
      if (0xe10 < iVar2) {
        iVar4 = iVar2;
      }
      if (iVar8 != Instance::queue.num_passes) {
        iVar4 = iVar2;
      }
      uStack_1cd80 = CONCAT44(iVar4,iVar3);
      lVar5 = (long)Instance::queue.active_commands.
                    super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)Instance::queue.active_commands.
                    super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
      for (lVar6 = 0; lVar5 >> 3 != lVar6; lVar6 = lVar6 + 1) {
        (*Instance::queue.active_commands.
          super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6]->_vptr_DrawerCommand[2])
                  (Instance::queue.active_commands.
                   super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6],&tStack_1cd90);
      }
    }
    std::unique_lock<std::mutex>::unique_lock(&uStack_1cdb0,&Instance::queue.end_mutex);
    while (Instance::queue.finished_threads !=
           ((long)Instance::queue.threads.
                  super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)Instance::queue.threads.
                 super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x1cd68) {
      std::condition_variable::wait((unique_lock *)&Instance::queue.end_condition);
    }
    ppDVar7 = Instance::queue.active_commands.
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppDVar1 = Instance::queue.active_commands.
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (*(int *)(Instance::queue.thread_error.Chars + -0xc) != 0) {
      if (Instance::queue.thread_error_fatal == true) {
        I_FatalError("%s");
      }
      else if (Finish()::first == '\0') {
        Printf("%s\n",Instance::queue.thread_error.Chars,
               ((long)Instance::queue.threads.
                      super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)Instance::queue.threads.
                     super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
                     super__Vector_impl_data._M_start) % 0x1cd68);
      }
      Finish()::first = '\x01';
      ppDVar7 = Instance::queue.active_commands.
                super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppDVar1 = Instance::queue.active_commands.
                super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    for (; ppDVar7 != ppDVar1; ppDVar7 = ppDVar7 + 1) {
      (**(*ppDVar7)->_vptr_DrawerCommand)();
    }
    if (Instance::queue.active_commands.
        super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        Instance::queue.active_commands.
        super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      Instance::queue.active_commands.
      super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           Instance::queue.active_commands.
           super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    Instance::queue.memorypool_pos = 0;
    Instance::queue.finished_threads = 0;
    std::unique_lock<std::mutex>::~unique_lock(&uStack_1cdb0);
    std::thread::~thread(&tStack_1cd90);
    std::unique_lock<std::mutex>::~unique_lock(&uStack_1cda0);
  }
  return;
}

Assistant:

void DrawerCommandQueue::Finish()
{
	auto queue = Instance();
	if (queue->commands.empty())
		return;

	// Give worker threads something to do:

	std::unique_lock<std::mutex> start_lock(queue->start_mutex);
	queue->active_commands.swap(queue->commands);
	queue->run_id++;
	start_lock.unlock();

	queue->StartThreads();
	queue->start_condition.notify_all();

	// Do one thread ourselves:

	DrawerThread thread;
	thread.core = 0;
	thread.num_cores = (int)(queue->threads.size() + 1);

	struct TryCatchData
	{
		DrawerCommandQueue *queue;
		DrawerThread *thread;
		size_t command_index;
	} data;

	data.queue = queue;
	data.thread = &thread;
	data.command_index = 0;
	VectoredTryCatch(&data,
	[](void *data)
	{
		TryCatchData *d = (TryCatchData*)data;

		for (int pass = 0; pass < d->queue->num_passes; pass++)
		{
			d->thread->pass_start_y = pass * d->queue->rows_in_pass;
			d->thread->pass_end_y = (pass + 1) * d->queue->rows_in_pass;
			if (pass + 1 == d->queue->num_passes)
				d->thread->pass_end_y = MAX(d->thread->pass_end_y, MAXHEIGHT);

			size_t size = d->queue->active_commands.size();
			for (d->command_index = 0; d->command_index < size; d->command_index++)
			{
				auto &command = d->queue->active_commands[d->command_index];
				command->Execute(d->thread);
			}
		}
	},
	[](void *data, const char *reason, bool fatal)
	{
		TryCatchData *d = (TryCatchData*)data;
		ReportDrawerError(d->queue->active_commands[d->command_index], true, reason, fatal);
	});

	// Wait for everyone to finish:

	std::unique_lock<std::mutex> end_lock(queue->end_mutex);
	queue->end_condition.wait(end_lock, [&]() { return queue->finished_threads == queue->threads.size(); });

	if (!queue->thread_error.IsEmpty())
	{
		static bool first = true;
		if (queue->thread_error_fatal)
			I_FatalError("%s", queue->thread_error.GetChars());
		else if (first)
			Printf("%s\n", queue->thread_error.GetChars());
		first = false;
	}

	// Clean up batch:

	for (auto &command : queue->active_commands)
		command->~DrawerCommand();
	queue->active_commands.clear();
	queue->memorypool_pos = 0;
	queue->finished_threads = 0;
}